

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::removeMember(Value *this,char *key)

{
  size_t sVar1;
  CZString actualKey;
  String SStack_1a8;
  key_type local_188 [23];
  
  if (*(char *)&this->bits_ != '\0') {
    if (*(char *)&this->bits_ != '\a') {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
      std::operator<<((ostream *)local_188,"in Json::Value::removeMember(): requires objectValue");
      std::__cxx11::stringbuf::str();
      throwLogicError(&SStack_1a8);
    }
    sVar1 = strlen(key);
    local_188[0].field_1.index_ = (int)sVar1 << 2;
    local_188[0].cstr_ = key;
    std::
    _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::erase(&((this->value_).map_)->_M_t,local_188);
    CZString::~CZString(local_188);
  }
  return;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}